

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_encrypt.c
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  size_t sVar2;
  FILE *pFVar3;
  size_t sVar4;
  char *pcVar5;
  char *pers;
  uchar buf [512];
  uchar input [1024];
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  mbedtls_rsa_context rsa;
  size_t i;
  int exit_val;
  int return_val;
  FILE *f;
  char **argv_local;
  int argc_local;
  
  i._0_4_ = 0;
  if (argc != 2) {
    printf("usage: rsa_encrypt <string of max 100 characters>\n");
    exit(1);
  }
  printf("\n  . Seeding the random number generator...");
  fflush(_stdout);
  mbedtls_rsa_init((mbedtls_rsa_context *)&entropy.source[0x13].strong,0,0);
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)(input + 0x3f8));
  mbedtls_entropy_init((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  sVar2 = strlen("rsa_encrypt");
  uVar1 = mbedtls_ctr_drbg_seed
                    ((mbedtls_ctr_drbg_context *)(input + 0x3f8),mbedtls_entropy_func,
                     &ctr_drbg.p_entropy,(uchar *)"rsa_encrypt",sVar2);
  if (uVar1 == 0) {
    printf("\n  . Reading public key from rsa_pub.txt");
    fflush(_stdout);
    pFVar3 = fopen("rsa_pub.txt","rb");
    if (pFVar3 == (FILE *)0x0) {
      i._0_4_ = 1;
      printf(" failed\n  ! Could not open rsa_pub.txt\n  ! Please run rsa_genkey first\n\n");
    }
    else {
      i._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.len,0x10,(FILE *)pFVar3);
      if (i._4_4_ == 0) {
        i._4_4_ = mbedtls_mpi_read_file((mbedtls_mpi *)&rsa.N.p,0x10,(FILE *)pFVar3);
        if (i._4_4_ == 0) {
          sVar4 = mbedtls_mpi_bitlen((mbedtls_mpi *)&rsa.len);
          rsa._0_8_ = sVar4 + 7 >> 3;
          fclose(pFVar3);
          sVar2 = strlen(argv[1]);
          if (sVar2 < 0x65) {
            pcVar5 = argv[1];
            sVar2 = strlen(argv[1]);
            memcpy(buf + 0x1f8,pcVar5,sVar2);
            printf("\n  . Generating the RSA encrypted value");
            fflush(_stdout);
            sVar2 = strlen(argv[1]);
            uVar1 = mbedtls_rsa_pkcs1_encrypt
                              ((mbedtls_rsa_context *)&entropy.source[0x13].strong,
                               mbedtls_ctr_drbg_random,input + 0x3f8,0,sVar2,buf + 0x1f8,
                               (uchar *)&pers);
            if (uVar1 == 0) {
              pFVar3 = fopen("result-enc.txt","wb+");
              if (pFVar3 == (FILE *)0x0) {
                i._0_4_ = 1;
                printf(" failed\n  ! Could not create %s\n\n","result-enc.txt");
              }
              else {
                rsa.padding = 0;
                rsa.hash_id = 0;
                for (; (ulong)rsa._328_8_ < (ulong)rsa._0_8_; rsa._328_8_ = rsa._328_8_ + 1) {
                  pcVar5 = " ";
                  if ((rsa._328_8_ + 1 & 0xf) == 0) {
                    pcVar5 = "\r\n";
                  }
                  fprintf(pFVar3,"%02X%s",(ulong)buf[rsa._328_8_ + -8],pcVar5);
                }
                fclose(pFVar3);
                printf("\n  . Done (created \"%s\")\n\n","result-enc.txt");
              }
            }
            else {
              i._0_4_ = 1;
              printf(" failed\n  ! mbedtls_rsa_pkcs1_encrypt returned %d\n\n",(ulong)uVar1);
            }
          }
          else {
            i._0_4_ = 1;
            printf(" Input data larger than 100 characters.\n\n");
          }
          goto LAB_00106656;
        }
      }
      i._0_4_ = 1;
      printf(" failed\n  ! mbedtls_mpi_read_file returned %d\n\n",(ulong)i._4_4_);
      fclose(pFVar3);
    }
  }
  else {
    i._0_4_ = 1;
    printf(" failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",(ulong)uVar1);
  }
LAB_00106656:
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)(input + 0x3f8));
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  mbedtls_rsa_free((mbedtls_rsa_context *)&entropy.source[0x13].strong);
  return (int)i;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int return_val, exit_val;
    size_t i;
    mbedtls_rsa_context rsa;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    unsigned char input[1024];
    unsigned char buf[512];
    const char *pers = "rsa_encrypt";

    exit_val = MBEDTLS_EXIT_SUCCESS;

    if( argc != 2 )
    {
        mbedtls_printf( "usage: rsa_encrypt <string of max 100 characters>\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        mbedtls_exit( MBEDTLS_EXIT_FAILURE );
    }

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_rsa_init( &rsa, MBEDTLS_RSA_PKCS_V15, 0 );
    mbedtls_ctr_drbg_init( &ctr_drbg );
    mbedtls_entropy_init( &entropy );

    return_val = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func,
                                        &entropy, (const unsigned char *) pers,
                                        strlen( pers ) );
    if( return_val != 0 )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n",
                        return_val );
        goto exit;
    }

    mbedtls_printf( "\n  . Reading public key from rsa_pub.txt" );
    fflush( stdout );

    if( ( f = fopen( "rsa_pub.txt", "rb" ) ) == NULL )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( " failed\n  ! Could not open rsa_pub.txt\n" \
                "  ! Please run rsa_genkey first\n\n" );
        goto exit;
    }

    if( ( return_val = mbedtls_mpi_read_file( &rsa.N, 16, f ) ) != 0 ||
        ( return_val = mbedtls_mpi_read_file( &rsa.E, 16, f ) ) != 0 )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( " failed\n  ! mbedtls_mpi_read_file returned %d\n\n",
                        return_val );
        fclose( f );
        goto exit;
    }

    rsa.len = ( mbedtls_mpi_bitlen( &rsa.N ) + 7 ) >> 3;

    fclose( f );

    if( strlen( argv[1] ) > 100 )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( " Input data larger than 100 characters.\n\n" );
        goto exit;
    }

    memcpy( input, argv[1], strlen( argv[1] ) );

    /*
     * Calculate the RSA encryption of the hash.
     */
    mbedtls_printf( "\n  . Generating the RSA encrypted value" );
    fflush( stdout );

    return_val = mbedtls_rsa_pkcs1_encrypt( &rsa, mbedtls_ctr_drbg_random,
                                            &ctr_drbg, MBEDTLS_RSA_PUBLIC,
                                            strlen( argv[1] ), input, buf );
    if( return_val != 0 )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( " failed\n  ! mbedtls_rsa_pkcs1_encrypt returned %d\n\n",
                        return_val );
        goto exit;
    }

    /*
     * Write the signature into result-enc.txt
     */
    if( ( f = fopen( "result-enc.txt", "wb+" ) ) == NULL )
    {
        exit_val = MBEDTLS_EXIT_FAILURE;
        mbedtls_printf( " failed\n  ! Could not create %s\n\n", "result-enc.txt" );
        goto exit;
    }

    for( i = 0; i < rsa.len; i++ )
        mbedtls_fprintf( f, "%02X%s", buf[i],
                 ( i + 1 ) % 16 == 0 ? "\r\n" : " " );

    fclose( f );

    mbedtls_printf( "\n  . Done (created \"%s\")\n\n", "result-enc.txt" );

exit:
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );
    mbedtls_rsa_free( &rsa );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_val );
}